

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_get_crt_ext(uchar **p,uchar *end,mbedtls_x509_crt *crt,mbedtls_x509_crt_ext_cb_t cb,
                    void *p_ctx)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *end_00;
  uchar *end_01;
  undefined1 auStack_68 [8];
  mbedtls_x509_buf extn_oid;
  size_t local_48;
  size_t len;
  uint local_38;
  int local_34;
  int ext_type;
  int is_critical;
  
  if (*p == end) {
    iVar2 = 0;
  }
  else {
    iVar2 = mbedtls_x509_get_ext(p,end,&crt->v3_ext,3);
    if (iVar2 == 0) {
      end_01 = (crt->v3_ext).p + (crt->v3_ext).len;
      puVar4 = *p;
      if (puVar4 < end_01) {
        len = (size_t)crt;
        do {
          auStack_68 = (undefined1  [8])0x0;
          extn_oid.tag = 0;
          extn_oid._4_4_ = 0;
          extn_oid.len = 0;
          local_34 = 0;
          local_38 = 0;
          iVar2 = mbedtls_asn1_get_tag(p,end_01,&local_48,0x30);
          if (iVar2 != 0) {
LAB_002197d5:
            return iVar2 + -0x2500;
          }
          puVar4 = *p + local_48;
          iVar2 = mbedtls_asn1_get_tag(p,puVar4,(size_t *)&extn_oid,6);
          if (iVar2 != 0) goto LAB_002197d5;
          auStack_68._0_4_ = 6;
          extn_oid.len = (size_t)*p;
          *p = (uchar *)(extn_oid.len + extn_oid._0_8_);
          iVar2 = mbedtls_asn1_get_bool(p,puVar4,&local_34);
          if (((iVar2 != -0x62) && (iVar2 != 0)) ||
             (iVar2 = mbedtls_asn1_get_tag(p,puVar4,&local_48,4), iVar2 != 0)) goto LAB_002197d5;
          puVar1 = *p;
          end_00 = puVar1 + local_48;
          if (end_00 != puVar4) {
            return -0x2566;
          }
          iVar2 = mbedtls_oid_get_x509_ext_type((mbedtls_asn1_buf *)auStack_68,(int *)&local_38);
          if (iVar2 == 0) {
            if ((local_38 & *(uint *)(len + 0x288)) != 0) {
              return -0x2500;
            }
            *(uint *)(len + 0x288) = *(uint *)(len + 0x288) | local_38;
            if ((int)local_38 < 0x20) {
              switch(local_38) {
              case 1:
                iVar2 = x509_get_authority_key_id(p,end_00,&crt->authority_key_id);
                break;
              case 2:
                iVar2 = x509_get_subject_key_id(p,puVar4,&crt->subject_key_id);
                break;
              default:
switchD_0021962e_caseD_3:
                if (local_34 != 0) {
                  return -0x2080;
                }
                goto LAB_002195ea;
              case 4:
                iVar2 = mbedtls_x509_get_key_usage(p,end_00,&crt->key_usage);
                break;
              case 8:
                iVar2 = x509_get_certificate_policies(p,end_00,&crt->certificate_policies);
                if ((iVar2 != 0) &&
                   ((iVar2 != -0x2080 || cb == (mbedtls_x509_crt_ext_cb_t)0x0 ||
                    (iVar3 = (*cb)(p_ctx,(mbedtls_x509_crt *)len,(mbedtls_x509_buf *)auStack_68,
                                   local_34,puVar1,end_00), iVar3 != 0)))) {
                  if (iVar2 != -0x2080) {
                    return iVar2;
                  }
joined_r0x0021979b:
                  if (local_34 != 0) {
                    return iVar2;
                  }
                }
                goto LAB_00219762;
              }
            }
            else if ((int)local_38 < 0x800) {
              if (local_38 == 0x20) {
                iVar2 = mbedtls_x509_get_subject_alt_name(p,end_00,&crt->subject_alt_names);
              }
              else {
                if (local_38 != 0x100) goto switchD_0021962e_caseD_3;
                iVar2 = x509_get_basic_constraints(p,end_00,&crt->ca_istrue,&crt->max_pathlen);
              }
            }
            else {
              if (local_38 == 0x800) {
                iVar2 = mbedtls_asn1_get_sequence_of(p,end_00,&crt->ext_key_usage,6);
                if (iVar2 != 0) {
                  iVar2 = iVar2 + -0x2500;
                  local_34 = iVar2;
                  goto joined_r0x0021979b;
                }
                if (*(long *)(len + 0x2a8) == 0) {
                  return -0x2564;
                }
                goto LAB_00219762;
              }
              if (local_38 != 0x10000) goto switchD_0021962e_caseD_3;
              iVar2 = mbedtls_x509_get_ns_cert_type(p,end_00,&crt->ns_cert_type);
            }
            if (iVar2 != 0) {
              return iVar2;
            }
          }
          else if (cb == (mbedtls_x509_crt_ext_cb_t)0x0) {
            *p = end_00;
            if (local_34 != 0) {
              return -0x2562;
            }
          }
          else {
            iVar2 = (*cb)(p_ctx,(mbedtls_x509_crt *)len,(mbedtls_x509_buf *)auStack_68,local_34,*p,
                          end_00);
            if ((iVar2 != 0) && (local_34 != 0)) {
              return iVar2;
            }
LAB_002195ea:
            *p = end_00;
          }
LAB_00219762:
          puVar4 = *p;
        } while (puVar4 < end_01);
      }
      iVar2 = -0x2566;
      if (puVar4 == end_01) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int x509_get_crt_ext(unsigned char **p,
                            const unsigned char *end,
                            mbedtls_x509_crt *crt,
                            mbedtls_x509_crt_ext_cb_t cb,
                            void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    unsigned char *end_ext_data, *start_ext_octet, *end_ext_octet;

    if (*p == end) {
        return 0;
    }

    if ((ret = mbedtls_x509_get_ext(p, end, &crt->v3_ext, 3)) != 0) {
        return ret;
    }

    end = crt->v3_ext.p + crt->v3_ext.len;
    while (*p < end) {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        mbedtls_x509_buf extn_oid = { 0, 0, NULL };
        int is_critical = 0; /* DEFAULT FALSE */
        int ext_type = 0;

        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        end_ext_data = *p + len;

        /* Get extension ID */
        if ((ret = mbedtls_asn1_get_tag(p, end_ext_data, &extn_oid.len,
                                        MBEDTLS_ASN1_OID)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        extn_oid.tag = MBEDTLS_ASN1_OID;
        extn_oid.p = *p;
        *p += extn_oid.len;

        /* Get optional critical */
        if ((ret = mbedtls_asn1_get_bool(p, end_ext_data, &is_critical)) != 0 &&
            (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG)) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        /* Data should be octet string type */
        if ((ret = mbedtls_asn1_get_tag(p, end_ext_data, &len,
                                        MBEDTLS_ASN1_OCTET_STRING)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        start_ext_octet = *p;
        end_ext_octet = *p + len;

        if (end_ext_octet != end_ext_data) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
        }

        /*
         * Detect supported extensions
         */
        ret = mbedtls_oid_get_x509_ext_type(&extn_oid, &ext_type);

        if (ret != 0) {
            /* Give the callback (if any) a chance to handle the extension */
            if (cb != NULL) {
                ret = cb(p_ctx, crt, &extn_oid, is_critical, *p, end_ext_octet);
                if (ret != 0 && is_critical) {
                    return ret;
                }
                *p = end_ext_octet;
                continue;
            }

            /* No parser found, skip extension */
            *p = end_ext_octet;

            if (is_critical) {
                /* Data is marked as critical: fail */
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
            }
            continue;
        }

        /* Forbid repeated extensions */
        if ((crt->ext_types & ext_type) != 0) {
            return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
        }

        crt->ext_types |= ext_type;

        switch (ext_type) {
            case MBEDTLS_X509_EXT_BASIC_CONSTRAINTS:
                /* Parse basic constraints */
                if ((ret = x509_get_basic_constraints(p, end_ext_octet,
                                                      &crt->ca_istrue, &crt->max_pathlen)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_KEY_USAGE:
                /* Parse key usage */
                if ((ret = mbedtls_x509_get_key_usage(p, end_ext_octet,
                                                      &crt->key_usage)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE:
                /* Parse extended key usage */
                if ((ret = x509_get_ext_key_usage(p, end_ext_octet,
                                                  &crt->ext_key_usage)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_SUBJECT_KEY_IDENTIFIER:
                /* Parse subject key identifier */
                if ((ret = x509_get_subject_key_id(p, end_ext_data,
                                                   &crt->subject_key_id)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_AUTHORITY_KEY_IDENTIFIER:
                /* Parse authority key identifier */
                if ((ret = x509_get_authority_key_id(p, end_ext_octet,
                                                     &crt->authority_key_id)) != 0) {
                    return ret;
                }
                break;
            case MBEDTLS_X509_EXT_SUBJECT_ALT_NAME:
                /* Parse subject alt name
                 * SubjectAltName ::= GeneralNames
                 */
                if ((ret = mbedtls_x509_get_subject_alt_name(p, end_ext_octet,
                                                             &crt->subject_alt_names)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_NS_CERT_TYPE:
                /* Parse netscape certificate type */
                if ((ret = mbedtls_x509_get_ns_cert_type(p, end_ext_octet,
                                                         &crt->ns_cert_type)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_OID_X509_EXT_CERTIFICATE_POLICIES:
                /* Parse certificate policies type */
                if ((ret = x509_get_certificate_policies(p, end_ext_octet,
                                                         &crt->certificate_policies)) != 0) {
                    /* Give the callback (if any) a chance to handle the extension
                     * if it contains unsupported policies */
                    if (ret == MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE && cb != NULL &&
                        cb(p_ctx, crt, &extn_oid, is_critical,
                           start_ext_octet, end_ext_octet) == 0) {
                        break;
                    }

                    if (is_critical) {
                        return ret;
                    } else
                    /*
                     * If MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE is returned, then we
                     * cannot interpret or enforce the policy. However, it is up to
                     * the user to choose how to enforce the policies,
                     * unless the extension is critical.
                     */
                    if (ret != MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
                        return ret;
                    }
                }
                break;

            default:
                /*
                 * If this is a non-critical extension, which the oid layer
                 * supports, but there isn't an x509 parser for it,
                 * skip the extension.
                 */
                if (is_critical) {
                    return MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE;
                } else {
                    *p = end_ext_octet;
                }
        }
    }

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}